

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

Name __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::removeAt
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t index)

{
  string_view sVar1;
  size_t sVar2;
  ulong local_30;
  size_t i;
  size_t index_local;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this_local;
  Name item;
  
  sVar2 = size(this);
  if (index < sVar2) {
    sVar1 = *(string_view *)(this->data + index);
    local_30 = index;
    while( true ) {
      sVar2 = size(this);
      if (sVar2 - 1 <= local_30) break;
      ::wasm::Name::operator=(this->data + local_30,this->data + local_30 + 1);
      local_30 = local_30 + 1;
    }
    sVar2 = size(this);
    resize(this,sVar2 - 1);
    return (IString)(IString)sVar1;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x17d,
                "T ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::removeAt(size_t) [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
               );
}

Assistant:

T removeAt(size_t index) {
    assert(index < size());
    auto item = data[index];
    for (auto i = index; i < size() - 1; ++i) {
      data[i] = data[i + 1];
    }
    resize(size() - 1);
    return item;
  }